

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O3

el_action_t em_delete_prev_char(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  wchar_t *pwVar3;
  
  eVar2 = '\x06';
  if ((el->el_line).buffer < (el->el_line).cursor) {
    if ((el->el_state).doingarg == L'\0') {
      c_delbefore1(el);
    }
    else {
      c_delbefore(el,(el->el_state).argument);
    }
    pwVar1 = (el->el_line).buffer;
    pwVar3 = (el->el_line).cursor + -(long)(el->el_state).argument;
    if (pwVar3 < pwVar1) {
      pwVar3 = pwVar1;
    }
    (el->el_line).cursor = pwVar3;
    eVar2 = '\x04';
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_delete_prev_char(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor <= el->el_line.buffer)
		return CC_ERROR;

	if (el->el_state.doingarg)
		c_delbefore(el, el->el_state.argument);
	else
		c_delbefore1(el);
	el->el_line.cursor -= el->el_state.argument;
	if (el->el_line.cursor < el->el_line.buffer)
		el->el_line.cursor = el->el_line.buffer;
	return CC_REFRESH;
}